

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMemNumerify(Mem *pMem)

{
  double r1;
  ushort uVar1;
  uint uVar2;
  int iVar3;
  i64 in_RAX;
  sqlite3_int64 i;
  i64 local_18;
  
  uVar2 = (uint)pMem->flags;
  if ((pMem->flags & 0x2d) != 0) goto LAB_00171f29;
  local_18 = in_RAX;
  uVar2 = sqlite3AtoF(pMem->z,(double *)pMem,pMem->n,pMem->enc);
  if ((uVar2 < 2) && (iVar3 = sqlite3Atoi64(pMem->z,&local_18,pMem->n,pMem->enc), iVar3 < 2)) {
LAB_00171f0f:
    (pMem->u).i = local_18;
    uVar1 = 4;
  }
  else {
    i = 0x7fffffffffffffff;
    r1 = (pMem->u).r;
    if (r1 <= -9.223372036854776e+18) {
      i = -0x8000000000000000;
    }
    else if (r1 < 9.223372036854776e+18) {
      i = (sqlite3_int64)r1;
    }
    iVar3 = sqlite3RealSameAsInt(r1,i);
    local_18 = i;
    if (iVar3 != 0) goto LAB_00171f0f;
    uVar1 = 8;
  }
  uVar2._0_2_ = pMem->flags;
  uVar2._2_1_ = pMem->enc;
  uVar2._3_1_ = pMem->eSubtype;
  uVar2 = (uint)uVar1 | uVar2 & 0xfffff240;
LAB_00171f29:
  pMem->flags = (u16)(uVar2 & 0xfbed);
  return uVar2 & 0xfbed;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemNumerify(Mem *pMem){
  assert( pMem!=0 );
  testcase( pMem->flags & MEM_Int );
  testcase( pMem->flags & MEM_Real );
  testcase( pMem->flags & MEM_IntReal );
  testcase( pMem->flags & MEM_Null );
  if( (pMem->flags & (MEM_Int|MEM_Real|MEM_IntReal|MEM_Null))==0 ){
    int rc;
    sqlite3_int64 ix;
    assert( (pMem->flags & (MEM_Blob|MEM_Str))!=0 );
    assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
    rc = sqlite3AtoF(pMem->z, &pMem->u.r, pMem->n, pMem->enc);
    if( ((rc==0 || rc==1) && sqlite3Atoi64(pMem->z, &ix, pMem->n, pMem->enc)<=1)
     || sqlite3RealSameAsInt(pMem->u.r, (ix = sqlite3RealToI64(pMem->u.r)))
    ){
      pMem->u.i = ix;
      MemSetTypeFlag(pMem, MEM_Int);
    }else{
      MemSetTypeFlag(pMem, MEM_Real);
    }
  }
  assert( (pMem->flags & (MEM_Int|MEM_Real|MEM_IntReal|MEM_Null))!=0 );
  pMem->flags &= ~(MEM_Str|MEM_Blob|MEM_Zero);
  return SQLITE_OK;
}